

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O0

string_t duckdb::StringCast::Operation<duckdb::dtime_t>(dtime_t input,Vector *vector)

{
  string_t *this;
  dtime_t in_RDI;
  char *data;
  idx_t length;
  char micro_buffer [10];
  int32_t time [4];
  string_t result;
  int32_t *hour;
  Vector *vector_00;
  undefined1 *length_00;
  undefined1 local_50 [80];
  
  hour = (int32_t *)(local_50 + 0x18);
  Time::Convert(in_RDI,hour,(int32_t *)(local_50 + 0x1c),(int32_t *)(local_50 + 0x20),
                (int32_t *)(local_50 + 0x24));
  local_50[8] = INVALID;
  local_50[9] = ~INVALID;
  local_50._0_8_ = 0;
  vector_00 = (Vector *)local_50;
  TimeToStringCast::Length((int32_t *)vector_00,(char *)hour);
  local_50._64_16_ = (undefined1  [16])StringVector::EmptyString(vector_00,(idx_t)hour);
  length_00 = local_50 + 0x40;
  this = (string_t *)string_t::GetDataWriteable((string_t *)vector_00);
  TimeToStringCast::Format((char *)this,(idx_t)length_00,(int32_t *)vector_00,(char *)hour);
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50._64_16_;
}

Assistant:

duckdb::string_t StringCast::Operation(dtime_t input, Vector &vector) {
	int32_t time[4];
	Time::Convert(input, time[0], time[1], time[2], time[3]);

	char micro_buffer[10] = {};
	idx_t length = TimeToStringCast::Length(time, micro_buffer);

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	TimeToStringCast::Format(data, length, time, micro_buffer);

	result.Finalize();
	return result;
}